

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::CodePointToUtf8_abi_cxx11_(uint32_t code_point)

{
  uint32_t uVar1;
  uint in_ESI;
  string *in_RDI;
  char str [5];
  uint32_t in_stack_0000012c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  allocator<char> local_62;
  byte local_61;
  byte bVar2;
  byte in_stack_ffffffffffffffa1;
  byte in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_30 [36];
  uint local_c [3];
  
  if (in_ESI < 0x200000) {
    if (in_ESI < 0x80) {
      bVar2 = 0;
      local_61 = (byte)in_ESI;
    }
    else {
      local_c[0] = in_ESI;
      if (in_ESI < 0x800) {
        in_stack_ffffffffffffffa1 = 0;
        uVar1 = ChopLowBits(local_c,6);
        bVar2 = (byte)uVar1;
        local_61 = (byte)local_c[0] | 0xc0;
      }
      else if (in_ESI < 0x10000) {
        in_stack_ffffffffffffffa2 = 0;
        uVar1 = ChopLowBits(local_c,6);
        in_stack_ffffffffffffffa1 = (byte)uVar1 | 0x80;
        uVar1 = ChopLowBits(local_c,6);
        bVar2 = (byte)uVar1;
        local_61 = (byte)local_c[0] | 0xe0;
      }
      else {
        in_stack_ffffffffffffffa3 = 0;
        uVar1 = ChopLowBits(local_c,6);
        in_stack_ffffffffffffffa2 = (byte)uVar1 | 0x80;
        uVar1 = ChopLowBits(local_c,6);
        in_stack_ffffffffffffffa1 = (byte)uVar1 | 0x80;
        uVar1 = ChopLowBits(local_c,6);
        bVar2 = (byte)uVar1;
        local_61 = (byte)local_c[0] | 0xf0;
      }
      bVar2 = bVar2 | 0x80;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (allocator<char> *)
               CONCAT44(in_stack_ffffffffffffffa4,
                        CONCAT13(in_stack_ffffffffffffffa3,
                                 CONCAT12(in_stack_ffffffffffffffa2,
                                          CONCAT11(in_stack_ffffffffffffffa1,bVar2)))));
    std::allocator<char>::~allocator(&local_62);
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffb0;
    __lhs = in_RDI;
    String::FormatHexUInt32_abi_cxx11_(in_stack_0000012c);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  return in_RDI;
}

Assistant:

std::string CodePointToUtf8(uint32_t code_point) {
  if (code_point > kMaxCodePoint4) {
    return "(Invalid Unicode 0x" + String::FormatHexUInt32(code_point) + ")";
  }

  char str[5];  // Big enough for the largest valid code point.
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);  // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else {  // code_point <= kMaxCodePoint4
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  }
  return str;
}